

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<capnp::TwoPartyServer::AcceptedConnection> __thiscall
kj::
heap<capnp::TwoPartyServer::AcceptedConnection,capnp::Capability::Client&,kj::Own<kj::AsyncIoStream>>
          (kj *this,Client *params,Own<kj::AsyncIoStream> *params_1)

{
  AcceptedConnection *this_00;
  AcceptedConnection *extraout_RDX;
  Own<capnp::TwoPartyServer::AcceptedConnection> OVar1;
  Own<capnp::ClientHook> local_30;
  
  this_00 = (AcceptedConnection *)operator_new(0x1a0);
  (*((params->hook).ptr)->_vptr_ClientHook[4])(&local_30);
  capnp::TwoPartyServer::AcceptedConnection::AcceptedConnection
            (this_00,(Client *)&local_30,params_1);
  *(undefined8 **)this = &_::HeapDisposer<capnp::TwoPartyServer::AcceptedConnection>::instance;
  *(AcceptedConnection **)(this + 8) = this_00;
  Own<capnp::ClientHook>::dispose(&local_30);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}